

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label.c
# Opt level: O1

int blob_write_plot(blob_t *blobs,int count,char *filename)

{
  blob_t *pbVar1;
  int iVar2;
  FILE *__stream;
  long lVar3;
  long lVar4;
  ulong uVar5;
  
  __stream = fopen(filename,"wb");
  if (__stream == (FILE *)0x0) {
    blob_write_plot_cold_1();
    iVar2 = 0;
  }
  else {
    if (0 < count) {
      uVar5 = 0;
      do {
        pbVar1 = blobs + uVar5;
        contour_write_plot(&pbVar1->external,(short)*(undefined4 *)pbVar1 * 2,(FILE *)__stream);
        fputc(10,__stream);
        if ((pbVar1->internal != (contour_t *)0x0) &&
           (pbVar1 = blobs + uVar5, 0 < pbVar1->internal_count)) {
          lVar3 = 0;
          lVar4 = 0;
          do {
            contour_write_plot((contour_t *)((long)&pbVar1->internal->count + lVar3),
                               (short)*(undefined4 *)pbVar1 * 2 + 1,(FILE *)__stream);
            fputc(10,__stream);
            lVar4 = lVar4 + 1;
            lVar3 = lVar3 + 0x10;
          } while (lVar4 < pbVar1->internal_count);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != (uint)count);
    }
    fclose(__stream);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int blob_write_plot(blob_t *blobs, int count, const char *filename)
{
    int i;
    FILE *out = fopen(filename, "wb");
    if(NULL == out)
    {
        fprintf(stderr, "failed to open %s : %s\n", filename, strerror(errno));
        return 0;
    }

    for(i=0; i<count; i++)
    {
        contour_write_plot(&blobs[i].external, 2 * blobs[i].label, out);
        fprintf(out, "\n");
        if(NULL != blobs[i].internal)
        {
            int j;
            for(j=0; j<blobs[i].internal_count; j++)
            {
                contour_write_plot(blobs[i].internal + j,  (2 * blobs[i].label) + 1, out);
                fprintf(out, "\n");
            }
        }
    }
    fclose(out);
    return 1;
}